

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QPointF * __thiscall QPlainTextEdit::cursorForPosition(QPlainTextEdit *this,QPoint *pos)

{
  long lVar1;
  QPlainTextEditPrivate *this_00;
  QWidgetTextControl *in_RDX;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QPlainTextEditPrivate *d;
  QPoint *in_stack_ffffffffffffff98;
  QPoint *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPlainTextEdit *)0x6c815c);
  QPlainTextEditPrivate::mapToContents(this_00,in_stack_ffffffffffffffb8);
  QPointF::QPointF(in_RDI,in_stack_ffffffffffffff98);
  QWidgetTextControl::cursorForPosition(in_RDX,(QPointF *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextCursor QPlainTextEdit::cursorForPosition(const QPoint &pos) const
{
    Q_D(const QPlainTextEdit);
    return d->control->cursorForPosition(d->mapToContents(pos));
}